

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

ByteData *
cfd::core::WallyUtil::AddTweakPubkey
          (ByteData *__return_storage_ptr__,ByteData *pubkey,ByteData256 *tweak,bool is_tweak_check)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr___00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ByteData local_50;
  Secp256k1 local_38;
  Secp256k1 secp256k1;
  secp256k1_context_struct *context;
  bool is_tweak_check_local;
  ByteData256 *tweak_local;
  ByteData *pubkey_local;
  
  secp256k1.secp256k1_context_ = wally_get_secp_context();
  Secp256k1::Secp256k1(&local_38,secp256k1.secp256k1_context_);
  __return_storage_ptr___00 = &local_68;
  ByteData256::GetBytes(__return_storage_ptr___00,tweak);
  ByteData::ByteData(&local_50,__return_storage_ptr___00);
  Secp256k1::AddTweakPubkeySecp256k1Ec
            (__return_storage_ptr__,&local_38,pubkey,&local_50,is_tweak_check);
  ByteData::~ByteData((ByteData *)0x3f9819);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

ByteData WallyUtil::AddTweakPubkey(
    const ByteData& pubkey, const ByteData256& tweak, bool is_tweak_check) {
  struct secp256k1_context_struct* context = wally_get_secp_context();
  Secp256k1 secp256k1(context);
  return secp256k1.AddTweakPubkeySecp256k1Ec(
      pubkey, ByteData(tweak.GetBytes()), is_tweak_check);
}